

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
 __thiscall
FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::insert(FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,value_type *value)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  const_iterator in_RDI;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
  pVar3;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  pos;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *in_stack_ffffffffffffff88;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  bool local_5b;
  bool local_5a;
  bool local_59 [9];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *local_48;
  char local_39;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *local_38;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  *local_30;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
  local_28;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_20;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
  local_10;
  
  local_20 = in_RSI;
  local_30 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                         *)in_stack_ffffffffffffff88);
  local_38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                       *)in_stack_ffffffffffffff88);
  local_39 = ((in_RDI._M_current)->first).field_2._M_local_buf[9];
  local_28 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,float>*,std::vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>>,std::__cxx11::string,FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>::ValueToKeyComparator>
                       (local_30,local_38,local_20);
  local_48 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                       *)in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
                      *)in_stack_ffffffffffffff88);
  local_5b = true;
  if (!bVar1) {
    in_stack_ffffffffffffff88 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
          *)(&((in_RDI._M_current)->first).field_2._M_allocated_capacity + 1);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
    ::operator->(&local_28);
    local_5b = Catch::clara::std::
               less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator()(local_20,&in_stack_ffffffffffffff88->first,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x23e6c6);
    in_stack_ffffffffffffff90 = local_20;
  }
  if (local_5b == false) {
    local_5a = false;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>_&,_bool,_true>
              (&local_10,&local_28,&local_5a);
    uVar2 = extraout_RDX_00;
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,float>const*,std::vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>>
    ::__normal_iterator<std::pair<std::__cxx11::string,float>*>
              ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
                *)in_stack_ffffffffffffff90,
               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>
                *)in_stack_ffffffffffffff88);
    local_50._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
          *)std::
            vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
            ::emplace<std::pair<std::__cxx11::string,float>const&>
                      ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                        *)in_stack_ffffffffffffff90,in_RDI,in_stack_ffffffffffffff88);
    local_59[0] = true;
    std::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool>
    ::
    pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>,_bool,_true>
              (&local_10,&local_50,local_59);
    uVar2 = extraout_RDX;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = local_10.second;
  pVar3.first._M_current = local_10.first._M_current;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(const value_type& value) {
        //std::cout << "FlatMap::insert({" << value.first << ", " << value.second << "})\n";
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), value.first, valueToKeyComp_);
        //std::cout << "lower_bound found at " << pos - vec_.begin() << "\n";
        if (pos == vec_.end() || comp_(value.first, pos->first)) {
            //std::cout << "new element added\n";
            return {vec_.emplace(pos, value), true};
        } else {
            //std::cout << "duplicate detected.\n";
            return {pos, false};
        }
    }